

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O0

void __thiscall
GdlBinaryExpression::FixFeatureTestsInRules(GdlBinaryExpression *this,GrcFont *pfont)

{
  bool bVar1;
  GdlNumericExpression *staMsg;
  char *pcVar2;
  undefined8 in_RSI;
  long in_RDI;
  GdlFeatureSetting *pfset;
  GdlNumericExpression *pexpnum;
  GdlExpression *pexpNew;
  bool fErr;
  GdlFeatureDefn *pfeat;
  GdlLookupExpression *pexplookFeature;
  GdlFeatureDefn *in_stack_fffffffffffffe78;
  GdlLookupExpression *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe90;
  int n;
  allocator *paVar3;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  allocator *sta3;
  GdlFeatureDefn *sta2;
  GdlObject *pgdlobj;
  undefined8 in_stack_fffffffffffffed0;
  long *plVar4;
  int nID;
  GrcErrorList *in_stack_fffffffffffffed8;
  GdlLookupExpression *local_120;
  string *sta4;
  string *in_stack_fffffffffffffef8;
  string local_100 [32];
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [32];
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  GdlFeatureSetting *local_40;
  GdlNumericExpression *local_38;
  long local_30;
  undefined1 local_21;
  GdlFeatureDefn *local_20;
  GdlLookupExpression *local_18;
  undefined8 local_10;
  
  nID = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  n = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  sta4 = *(string **)(in_RDI + 0x40);
  local_10 = in_RSI;
  if (sta4 == (string *)0x0) {
    local_120 = (GdlLookupExpression *)0x0;
  }
  else {
    local_120 = (GdlLookupExpression *)
                __dynamic_cast(sta4,&GdlExpression::typeinfo,&GdlLookupExpression::typeinfo,0);
  }
  local_18 = local_120;
  bVar1 = GrcSymbolTableEntry::IsComparativeOp((GrcSymbolTableEntry *)in_stack_fffffffffffffe78);
  if (((bVar1) && (local_18 != (GdlLookupExpression *)0x0)) &&
     (bVar1 = GdlLookupExpression::NameFitsSymbolType
                        (in_stack_fffffffffffffe80,
                         (SymbolType)((ulong)in_stack_fffffffffffffe78 >> 0x20)), bVar1)) {
    GdlLookupExpression::Name(local_18);
    local_20 = GrcSymbolTableEntry::FeatureDefnData
                         ((GrcSymbolTableEntry *)
                          CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_30 = (**(code **)(**(long **)(in_RDI + 0x48) + 0x68))
                         (*(long **)(in_RDI + 0x48),local_20,&local_21);
    if (local_30 != *(long *)(in_RDI + 0x48)) {
      in_stack_fffffffffffffed8 = *(GrcErrorList **)(in_RDI + 0x48);
      if (in_stack_fffffffffffffed8 != (GrcErrorList *)0x0) {
        (**(code **)(*(long *)in_stack_fffffffffffffed8 + 0x10))();
      }
      *(long *)(in_RDI + 0x48) = local_30;
    }
    local_30 = (**(code **)(**(long **)(in_RDI + 0x48) + 0x80))
                         (*(long **)(in_RDI + 0x48),0xffff,local_10);
    if ((local_30 != 0) && (local_30 != *(long *)(in_RDI + 0x48))) {
      plVar4 = *(long **)(in_RDI + 0x48);
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 0x10))();
      }
      nID = (int)((ulong)plVar4 >> 0x20);
      *(long *)(in_RDI + 0x48) = local_30;
    }
    pgdlobj = *(GdlObject **)(in_RDI + 0x48);
    if (pgdlobj == (GdlObject *)0x0) {
      staMsg = (GdlNumericExpression *)0x0;
    }
    else {
      staMsg = (GdlNumericExpression *)
               __dynamic_cast(pgdlobj,&GdlExpression::typeinfo,&GdlNumericExpression::typeinfo,0);
    }
    if ((staMsg != (GdlNumericExpression *)0x0) &&
       (local_38 = staMsg, bVar1 = GdlFeatureDefn::IsLanguageFeature(local_20), !bVar1)) {
      sta2 = local_20;
      GdlNumericExpression::Value(local_38);
      local_40 = GdlFeatureDefn::FindSettingWithValue
                           ((GdlFeatureDefn *)
                            CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),n);
      if (local_40 == (GdlFeatureSetting *)0x0) {
        sta3 = &local_61;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_60,"Feature \'",sta3);
        GdlFeatureDefn::Name_abi_cxx11_(in_stack_fffffffffffffe78);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b8,"\' has no setting with value ",&local_b9);
        GdlNumericExpression::Value(local_38);
        std::__cxx11::to_string((int)((ulong)pgdlobj >> 0x20));
        pcVar2 = "";
        if (-1 < local_38->m_munits) {
          pcVar2 = "m";
        }
        paVar3 = (allocator *)&stack0xfffffffffffffeff;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_100,pcVar2,paVar3);
        GrcErrorList::AddWarning
                  (in_stack_fffffffffffffed8,nID,pgdlobj,(string *)staMsg,(string *)sta2,
                   (string *)sta3,sta4,in_stack_fffffffffffffef8);
        std::__cxx11::string::~string(local_100);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeff);
        std::__cxx11::string::~string(local_e0);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        std::__cxx11::string::~string(local_98);
        std::__cxx11::string::~string(local_60);
        std::allocator<char>::~allocator((allocator<char> *)&local_61);
      }
    }
  }
  else {
    (**(code **)(**(long **)(in_RDI + 0x40) + 0x60))(*(long **)(in_RDI + 0x40),local_10);
    (**(code **)(**(long **)(in_RDI + 0x48) + 0x60))(*(long **)(in_RDI + 0x48),local_10);
  }
  return;
}

Assistant:

void GdlBinaryExpression::FixFeatureTestsInRules(GrcFont *pfont)
{

	GdlLookupExpression * pexplookFeature =
		dynamic_cast<GdlLookupExpression *>(m_pexpOperand1);

	if (m_psymOperator->IsComparativeOp() && pexplookFeature &&
		pexplookFeature->NameFitsSymbolType(ksymtFeature))
	{
		GdlFeatureDefn * pfeat = pexplookFeature->Name()->FeatureDefnData();
		Assert(pfeat);
		bool fErr;
		GdlExpression * pexpNew = m_pexpOperand2->ConvertFeatureSettingValue(pfeat, fErr);
		if (pexpNew != m_pexpOperand2)
		{
			delete m_pexpOperand2;
			m_pexpOperand2 = pexpNew;
		}

		pexpNew = m_pexpOperand2->SimplifyAndUnscale(0xFFFF, pfont);
		Assert(pexpNew);
		if (pexpNew && pexpNew != m_pexpOperand2)
		{
			delete m_pexpOperand2;
			m_pexpOperand2 = pexpNew;
		}

		GdlNumericExpression * pexpnum = dynamic_cast<GdlNumericExpression *>(m_pexpOperand2);
		if (pexpnum)
		{
			if (!pfeat->IsLanguageFeature())
			{
				GdlFeatureSetting * pfset = pfeat->FindSettingWithValue(pexpnum->Value());
				if (!pfset)
				{
					g_errorList.AddWarning(2514, this,
						"Feature '",
						pfeat->Name(),
						"' has no setting with value ",
						std::to_string(pexpnum->Value()),
						((pexpnum->m_munits >= kmunitDefault) ? "m" : ""));
				}
			}
		}
	}
	else
	{
		m_pexpOperand1->FixFeatureTestsInRules(pfont);
		m_pexpOperand2->FixFeatureTestsInRules(pfont);
	}
}